

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::ComputeStartingPoint(LpSolver *this,IPM *ipm)

{
  KKTSolver *in_RSI;
  Iterate *in_RDI;
  double dVar1;
  KKTSolverDiag kkt;
  Timer timer;
  Info *in_stack_ffffffffffffff08;
  IPM *this_00;
  Model *in_stack_ffffffffffffff50;
  Control *in_stack_ffffffffffffff58;
  KKTSolverDiag *in_stack_ffffffffffffff60;
  
  Timer::Timer((Timer *)in_RDI);
  this_00 = (IPM *)&stack0xffffffffffffff38;
  KKTSolverDiag::KKTSolverDiag
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::get
            ((unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)in_RDI);
  IPM::StartingPoint(this_00,in_RSI,in_RDI,in_stack_ffffffffffffff08);
  dVar1 = Timer::Elapsed((Timer *)in_RDI);
  in_RDI[5].mu_min_ = dVar1 + in_RDI[5].mu_min_;
  KKTSolverDiag::~KKTSolverDiag((KKTSolverDiag *)in_RDI);
  return;
}

Assistant:

void LpSolver::ComputeStartingPoint(IPM& ipm) {
    Timer timer;
    KKTSolverDiag kkt(control_, model_);

    // If the starting point procedure fails, then iterate_ remains as
    // initialized by the constructor, which is a valid state for
    // postprocessing/postsolving.
    ipm.StartingPoint(&kkt, iterate_.get(), &info_);
    info_.time_ipm1 += timer.Elapsed();
}